

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O1

void __thiscall spvtools::opt::LoopPeeling::PeelAfter(LoopPeeling *this,uint32_t peel_factor)

{
  IRContext *this_00;
  iterator instr;
  Loop *this_01;
  bool bVar1;
  char cVar2;
  uint32_t op1;
  uint uVar3;
  Instruction *pIVar4;
  Instruction *pIVar5;
  BasicBlock *pBVar6;
  BasicBlock *pBVar7;
  uint32_t op2;
  InstructionBuilder builder;
  LoopCloningResult clone_results;
  _Any_data local_198;
  code *local_188;
  code *pcStack_180;
  Instruction *local_170;
  undefined8 *local_168;
  undefined8 uStack_160;
  code *local_158;
  code *pcStack_150;
  InstructionBuilder local_148;
  LoopCloningResult local_128;
  
  bVar1 = CanPeelLoop(this);
  if (!bVar1) {
    __assert_fail("CanPeelLoop() && \"Cannot peel loop\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x1dd,"void spvtools::opt::LoopPeeling::PeelAfter(uint32_t)");
  }
  local_128.ptr_map_._M_h._M_buckets = &local_128.ptr_map_._M_h._M_single_bucket;
  local_128.ptr_map_._M_h._M_bucket_count = 1;
  local_128.ptr_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128.ptr_map_._M_h._M_element_count = 0;
  local_128.ptr_map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_128.ptr_map_._M_h._M_rehash_policy._M_next_resize = 0;
  local_128.ptr_map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_128.value_map_._M_h._M_buckets = &local_128.value_map_._M_h._M_single_bucket;
  local_128.value_map_._M_h._M_bucket_count = 1;
  local_128.value_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128.value_map_._M_h._M_element_count = 0;
  local_128.value_map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_128.value_map_._M_h._M_rehash_policy._M_next_resize = 0;
  local_128.value_map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_128.old_to_new_bb_._M_h._M_buckets = &local_128.old_to_new_bb_._M_h._M_single_bucket;
  local_128.old_to_new_bb_._M_h._M_bucket_count = 1;
  local_128.old_to_new_bb_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128.old_to_new_bb_._M_h._M_element_count = 0;
  local_128.old_to_new_bb_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_128.old_to_new_bb_._M_h._M_rehash_policy._M_next_resize = 0;
  local_128.old_to_new_bb_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_128.new_to_old_bb_._M_h._M_buckets = &local_128.new_to_old_bb_._M_h._M_single_bucket;
  local_128.new_to_old_bb_._M_h._M_bucket_count = 1;
  local_128.new_to_old_bb_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128.new_to_old_bb_._M_h._M_element_count = 0;
  local_128.new_to_old_bb_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_128.cloned_bb_.
  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.cloned_bb_.
  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.new_to_old_bb_._M_h._M_rehash_policy._M_next_resize = 0;
  local_128.new_to_old_bb_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_128.cloned_bb_.
  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DuplicateAndConnectLoop(this,&local_128);
  InsertCanonicalInductionVariable(this,&local_128);
  pBVar6 = this->cloned_loop_->loop_preheader_;
  pIVar4 = (pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar4 == (Instruction *)0x0) ||
     ((pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
    __assert_fail("!insts_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                  ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
  }
  this_00 = this->context_;
  instr.node_ = (pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
  local_148.parent_ = IRContext::get_instr_block(this_00,instr.node_);
  local_148.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
  local_148.context_ = this_00;
  local_148.insert_before_.super_iterator.node_ = (iterator)(iterator)instr.node_;
  pIVar4 = InstructionBuilder::GetIntConstant<unsigned_int>
                     (&local_148,peel_factor,this->int_type_->signed_);
  op2 = 0;
  op1 = 0;
  if (pIVar4->has_result_id_ == true) {
    op1 = Instruction::GetSingleWordOperand(pIVar4,(uint)pIVar4->has_type_id_);
  }
  pIVar5 = this->loop_iteration_count_;
  if (pIVar5->has_result_id_ == true) {
    op2 = Instruction::GetSingleWordOperand(pIVar5,(uint)pIVar5->has_type_id_);
  }
  pIVar5 = InstructionBuilder::AddLessThan(&local_148,op1,op2);
  pcStack_180 = std::
                _Function_handler<unsigned_int_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:498:20)>
                ::_M_invoke;
  local_188 = std::
              _Function_handler<unsigned_int_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:498:20)>
              ::_M_manager;
  local_198._M_unused._0_8_ = (undefined8)pIVar4;
  local_198._8_8_ = this;
  FixExitCondition(this,(function<unsigned_int_(spvtools::opt::Instruction_*)> *)&local_198);
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,__destroy_functor);
  }
  this_01 = this->cloned_loop_;
  pBVar6 = CreateBlockBefore(this,this->loop_->loop_preheader_);
  Loop::SetMergeBlock(this_01,pBVar6);
  pBVar7 = ProtectLoop(this,this->cloned_loop_,pIVar5,this->loop_->loop_preheader_);
  pBVar6 = this->loop_->loop_header_;
  local_158 = (code *)0x0;
  pcStack_150 = (code *)0x0;
  local_168 = (undefined8 *)0x0;
  uStack_160 = 0;
  local_168 = (undefined8 *)operator_new(0x18);
  *local_168 = &local_128;
  local_168[1] = pBVar7;
  local_168[2] = this;
  pcStack_150 = std::
                _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:533:7)>
                ::_M_invoke;
  local_158 = std::
              _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:533:7)>
              ::_M_manager;
  local_198._8_8_ = 0;
  pcStack_180 = std::
                _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
                ::_M_invoke;
  local_188 = std::
              _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
              ::_M_manager;
  pIVar4 = (pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_198._M_unused._M_object = &local_168;
  if ((pIVar4 != (Instruction *)0x0) &&
     ((pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar4 == (Instruction *)0x0) break;
      pIVar5 = (pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      cVar2 = '\0';
      if ((pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar5 = (Instruction *)0x0;
      }
      if (pIVar4->opcode_ == OpPhi) {
        local_170 = pIVar4;
        if (local_188 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        uVar3 = (*pcStack_180)(&local_198,&local_170);
        cVar2 = (char)uVar3;
        if (cVar2 != '\0') {
          pIVar4 = pIVar5;
        }
      }
    } while (cVar2 != '\0');
  }
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,__destroy_functor);
  }
  if (local_158 != (code *)0x0) {
    (*local_158)(&local_168,&local_168,3);
  }
  IRContext::InvalidateAnalysesExceptFor
            (this->context_,
             kAnalysisLoopAnalysis|kAnalysisCFG|kAnalysisInstrToBlockMapping|kAnalysisBegin);
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ::~vector(&local_128.cloned_bb_);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_128.new_to_old_bb_._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_128.old_to_new_bb_._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_128.value_map_._M_h);
  std::
  _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_128);
  return;
}

Assistant:

void LoopPeeling::PeelAfter(uint32_t peel_factor) {
  assert(CanPeelLoop() && "Cannot peel loop");
  LoopUtils::LoopCloningResult clone_results;

  // Clone the loop and insert the cloned one before the loop.
  DuplicateAndConnectLoop(&clone_results);

  // Add a canonical induction variable "canonical_induction_variable_".
  InsertCanonicalInductionVariable(&clone_results);

  InstructionBuilder builder(
      context_, &*cloned_loop_->GetPreHeaderBlock()->tail(),
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  Instruction* factor =
      builder.GetIntConstant(peel_factor, int_type_->IsSigned());

  Instruction* has_remaining_iteration = builder.AddLessThan(
      factor->result_id(), loop_iteration_count_->result_id());

  // Change the exit condition of the cloned loop to be (exit when become
  // false):
  //  "canonical_induction_variable_" + "factor" < "loop_iteration_count_"
  FixExitCondition([factor, this](Instruction* insert_before_point) {
    InstructionBuilder cond_builder(
        context_, insert_before_point,
        IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
    // Build the following check: canonical_induction_variable_ + factor <
    // iteration_count
    return cond_builder
        .AddLessThan(cond_builder
                         .AddIAdd(canonical_induction_variable_->type_id(),
                                  canonical_induction_variable_->result_id(),
                                  factor->result_id())
                         ->result_id(),
                     loop_iteration_count_->result_id())
        ->result_id();
  });

  // "Protect" the first loop: the first loop can only be executed if
  // factor < loop_iteration_count_.

  // The original loop's pre-header was the cloned loop merge block.
  GetClonedLoop()->SetMergeBlock(
      CreateBlockBefore(GetOriginalLoop()->GetPreHeaderBlock()));
  // Use the second loop preheader as if merge block.

  // Prevent the first loop if only the peeled loop needs it.
  BasicBlock* if_block = ProtectLoop(cloned_loop_, has_remaining_iteration,
                                     GetOriginalLoop()->GetPreHeaderBlock());

  // Patch the phi of the header block.
  // We added an if to enclose the first loop and because the phi node are
  // connected to the exit value of the first loop, the definition no longer
  // dominate the preheader.
  // We had to the preheader (our if merge block) the required phi instruction
  // and patch the header phi.
  GetOriginalLoop()->GetHeaderBlock()->ForEachPhiInst(
      [&clone_results, if_block, this](Instruction* phi) {
        analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

        auto find_value_idx = [](Instruction* phi_inst, Loop* loop) {
          uint32_t preheader_value_idx =
              !loop->IsInsideLoop(phi_inst->GetSingleWordInOperand(1)) ? 0 : 2;
          return preheader_value_idx;
        };

        Instruction* cloned_phi =
            def_use_mgr->GetDef(clone_results.value_map_.at(phi->result_id()));
        uint32_t cloned_preheader_value = cloned_phi->GetSingleWordInOperand(
            find_value_idx(cloned_phi, GetClonedLoop()));

        Instruction* new_phi =
            InstructionBuilder(context_,
                               &*GetOriginalLoop()->GetPreHeaderBlock()->tail(),
                               IRContext::kAnalysisDefUse |
                                   IRContext::kAnalysisInstrToBlockMapping)
                .AddPhi(phi->type_id(),
                        {phi->GetSingleWordInOperand(
                             find_value_idx(phi, GetOriginalLoop())),
                         GetClonedLoop()->GetMergeBlock()->id(),
                         cloned_preheader_value, if_block->id()});

        phi->SetInOperand(find_value_idx(phi, GetOriginalLoop()),
                          {new_phi->result_id()});
        def_use_mgr->AnalyzeInstUse(phi);
      });

  context_->InvalidateAnalysesExceptFor(
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping |
      IRContext::kAnalysisLoopAnalysis | IRContext::kAnalysisCFG);
}